

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer.c
# Opt level: O1

void buffer_from_data(buffer_t *buffer,uint8_t *data,size_t size)

{
  GHashTable *pGVar1;
  
  buffer->data = data;
  buffer->size = size;
  buffer->path = (char *)0x0;
  buffer->f = -1;
  *(undefined4 *)&buffer->start_mark = 0xffffffff;
  *(undefined4 *)((long)&buffer->start_mark + 4) = 0xffffffff;
  *(undefined4 *)&buffer->end_mark = 0xffffffff;
  *(undefined4 *)((long)&buffer->end_mark + 4) = 0xffffffff;
  buffer->cursor = 0;
  pGVar1 = (GHashTable *)g_hash_table_new_full(0,0,0,g_free);
  buffer->comments = pGVar1;
  buffer->highlights = (GSList *)0x0;
  buffer->bookmarks_head = -1;
  buffer->editable = 0;
  return;
}

Assistant:

void
buffer_from_data(buffer_t *buffer, const uint8_t *data, size_t size)
{
    buffer->data = (uint8_t*) data;
    buffer->size = size;
    buffer->path = NULL;
    buffer->f = -1;
    buffer->start_mark = -1;
    buffer->end_mark = -1;
    buffer->cursor = 0;
    buffer->comments = g_hash_table_new_full(NULL, NULL, NULL, g_free);
    buffer->highlights = NULL;
    buffer->bookmarks_head = -1;
    buffer->editable = 0;
}